

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O0

void __thiscall
BayesianGameCollaborativeGraphical::DistributeProbability
          (BayesianGameCollaborativeGraphical *this,Index jtI,double p)

{
  Index in_ESI;
  BayesianGameCollaborativeGraphical *in_RDI;
  undefined8 in_XMM0_Qa;
  vector<unsigned_int,_std::allocator<unsigned_int>_> restrictedIndivTypes;
  Index e;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypes;
  undefined1 *p_00;
  BayesianGameBase *in_stack_ffffffffffffffb0;
  undefined1 local_40 [16];
  double in_stack_ffffffffffffffd0;
  Index in_stack_ffffffffffffffdc;
  uint uVar1;
  BayesianGameBase *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  BayesianGameCollaborativeGraphical *this_00;
  
  this_00 = in_RDI;
  BayesianGameBase::SetProbability
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
  BayesianGameBase::JointToIndividualTypeIndices((BayesianGameBase *)this_00,in_ESI);
  for (uVar1 = 0; (ulong)uVar1 < in_RDI->_m_nrLRFs; uVar1 = uVar1 + 1) {
    p_00 = local_40;
    RestrictIndividualIndicesToScope<unsigned_int>
              (this_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       CONCAT44(in_ESI,in_stack_fffffffffffffff0),(Index)((ulong)in_XMM0_Qa >> 0x20)
              );
    std::vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>::
    operator[](&in_RDI->_m_LRFs,(ulong)uVar1);
    BayesianGameBase::AddProbability
              (in_stack_ffffffffffffffb0,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,(double)p_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void 
BayesianGameCollaborativeGraphical::DistributeProbability(Index jtI, double p)
{
    //set the probability of the joint type (represented by the 
    //BayesianGameBase )
    BayesianGameBase::SetProbability(jtI, p);

    //for each LRF add p to the consistent vars.
    const vector<Index> &indTypes = JointToIndividualTypeIndices(jtI);
    
    for(Index e = 0; e < _m_nrLRFs; e++)
    {    
        vector<Index> restrictedIndivTypes = RestrictIndividualIndicesToScope(
            indTypes, e);
        //now we have a smaller vector with the individual types restricted
        //to the agent in the scope of e
        _m_LRFs[e]->AddProbability(restrictedIndivTypes, p);
    }

}